

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (char *test_case_name,char *name,char *type_param,char *value_param,
          CodeLocation *code_location,TypeId fixture_class_id,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc,TestFactoryBase *factory)

{
  TestInfo *this;
  UnitTestImpl *this_00;
  CodeLocation local_b0;
  string local_88;
  string local_68;
  TypeId local_48;
  char *local_40;
  allocator local_32;
  allocator local_31;
  
  local_48 = fixture_class_id;
  local_40 = value_param;
  this = (TestInfo *)operator_new(0x108);
  std::__cxx11::string::string((string *)&local_88,test_case_name,&local_32);
  std::__cxx11::string::string((string *)&local_68,name,&local_31);
  CodeLocation::CodeLocation(&local_b0,code_location);
  TestInfo::TestInfo(this,&local_88,&local_68,type_param,local_40,&local_b0,local_48,factory);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  this_00 = GetUnitTestImpl();
  UnitTestImpl::AddTestInfo(this_00,set_up_tc,tear_down_tc,this);
  return this;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    const char* test_case_name,
    const char* name,
    const char* type_param,
    const char* value_param,
    CodeLocation code_location,
    TypeId fixture_class_id,
    SetUpTestCaseFunc set_up_tc,
    TearDownTestCaseFunc tear_down_tc,
    TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(test_case_name, name, type_param, value_param,
                   code_location, fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}